

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O1

void __thiscall duckdb::ValidityArray::Pack(ValidityArray *this,ValidityMask *mask,idx_t count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  _Head_base<0UL,_unsigned_long_*,_false> _Var5;
  idx_t j;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool *pbVar10;
  ulong uVar11;
  ulong uVar12;
  validity_t entry;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  idx_t local_28;
  
  if (this->validity_mask == (bool *)0x0) {
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    p_Var1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    (mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
  }
  else {
    (mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
    local_28 = count;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_38,&local_28);
    p_Var3 = p_Stack_30;
    peVar2 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar2;
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
    pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
    _Var5._M_head_impl =
         (pTVar4->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var5._M_head_impl;
    uVar8 = (ulong)((uint)count & 0x3f);
    if (count < 0x40) {
      lVar9 = 0;
    }
    else {
      pbVar10 = this->validity_mask;
      uVar7 = 0;
      lVar9 = 0;
      do {
        lVar6 = 0;
        uVar11 = 0;
        do {
          uVar12 = 1L << ((byte)lVar6 & 0x3f);
          if (pbVar10[lVar6] == false) {
            uVar12 = 0;
          }
          uVar11 = uVar11 | uVar12;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x40);
        lVar9 = lVar9 + 0x40;
        *_Var5._M_head_impl = uVar11;
        _Var5._M_head_impl = _Var5._M_head_impl + 1;
        uVar7 = uVar7 + 1;
        pbVar10 = pbVar10 + 0x40;
      } while (uVar7 != count >> 6);
    }
    if (uVar8 != 0) {
      uVar7 = 0;
      uVar11 = 0;
      do {
        uVar12 = 1L << ((byte)uVar7 & 0x3f);
        if (this->validity_mask[uVar7 + lVar9] == false) {
          uVar12 = 0;
        }
        uVar11 = uVar11 | uVar12;
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
      *_Var5._M_head_impl = uVar11;
    }
  }
  return;
}

Assistant:

inline void Pack(ValidityMask &mask, const idx_t count) const {
		if (AllValid()) {
			mask.Reset(count);
			return;
		}
		mask.Initialize(count);

		const auto entire_entries = count / ValidityMask::BITS_PER_VALUE;
		const auto ragged = count % ValidityMask::BITS_PER_VALUE;
		auto bits = mask.GetData();
		idx_t row_idx = 0;
		for (idx_t i = 0; i < entire_entries; ++i) {
			validity_t entry = 0;
			for (idx_t j = 0; j < ValidityMask::BITS_PER_VALUE; ++j) {
				if (RowIsValidUnsafe(row_idx++)) {
					entry |= validity_t(1) << j;
				}
			}
			*bits++ = entry;
		}
		if (ragged) {
			validity_t entry = 0;
			for (idx_t j = 0; j < ragged; ++j) {
				if (RowIsValidUnsafe(row_idx++)) {
					entry |= validity_t(1) << j;
				}
			}
			*bits++ = entry;
		}
	}